

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O3

void * __thiscall
ObjectBlockPool<64,_1024>::GetBasePointer(ObjectBlockPool<64,_1024> *this,void *ptr)

{
  LargeBlock<64,_1024> **ppLVar1;
  uint uVar2;
  void *pvVar3;
  uint uVar4;
  ulong uVar5;
  LargeBlock<64,_1024> *pLVar6;
  uint uVar7;
  
  uVar4 = (this->sortedPages).count;
  if (uVar4 != 0) {
    ppLVar1 = (this->sortedPages).data;
    pLVar6 = *ppLVar1;
    if (pLVar6 <= ptr) {
      uVar4 = uVar4 - 1;
      uVar5 = (ulong)uVar4;
      uVar2 = 0;
      pvVar3 = (void *)0x0;
      if (ptr <= ppLVar1[uVar5] + 1) {
        if (1 < uVar4) {
          uVar4 = 0;
          do {
            uVar2 = uVar4 + (int)uVar5 >> 1;
            pLVar6 = ppLVar1[uVar2];
            uVar7 = uVar4;
            if (pLVar6 < ptr) {
              uVar7 = uVar2;
            }
            if (ptr < pLVar6) {
              uVar5 = (ulong)uVar2;
              uVar7 = uVar4;
            }
            uVar4 = uVar7;
          } while (1 < (int)uVar5 - uVar7);
        }
        uVar4 = 0xffffffff;
        if (pLVar6 <= ptr) {
          uVar4 = (uint)(pLVar6 + 1 < ptr);
        }
        uVar5 = (long)ptr - (long)ppLVar1[uVar4 + uVar2]->page;
        pvVar3 = (void *)0x0;
        if (uVar5 < 0x10001) {
          pvVar3 = (void *)((long)ppLVar1[uVar4 + uVar2]->page + (ulong)((uint)uVar5 & 0x1ffc0) + 8)
          ;
        }
      }
      return pvVar3;
    }
  }
  return (void *)0x0;
}

Assistant:

void* GetBasePointer(void* ptr)
	{
		if(sortedPages.count == 0 || ptr < sortedPages.data[0] || ptr > (char*)sortedPages.data[sortedPages.count - 1] + sizeof(MyLargeBlock))
			return NULL;

		// Binary search
		unsigned lowerBound = 0;
		unsigned upperBound = sortedPages.count - 1;
		unsigned pointer = 0;

		while(upperBound - lowerBound > 1)
		{
			pointer = (lowerBound + upperBound) >> 1;

			if(ptr < sortedPages.data[pointer])
				upperBound = pointer;
			else if(ptr > sortedPages.data[pointer])
				lowerBound = pointer;
		}

		if(ptr < sortedPages.data[pointer])
			pointer--;
		else if(ptr > (char*)sortedPages.data[pointer] + sizeof(MyLargeBlock))
			pointer++;

		MyLargeBlock *best = sortedPages.data[pointer];

		uintptr_t fromBase = (uintptr_t)((char*)ptr - (char*)best->page);

		if(fromBase > sizeof(best->page))
			return NULL;

		return (char*)best->page + (unsigned(fromBase) & ~(elemSize - 1)) + sizeof(markerType);
	}